

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

size_t google::protobuf::internal::WireFormatLite::Int64Size(RepeatedField<long> *value)

{
  int iVar1;
  long lVar2;
  ulong *puVar3;
  int index;
  size_t sVar4;
  
  iVar1 = value->current_size_;
  index = 0;
  if (iVar1 < 1) {
    sVar4 = 0;
  }
  else {
    sVar4 = 0;
    do {
      puVar3 = (ulong *)RepeatedField<long>::Get(value,index);
      lVar2 = 0x3f;
      if ((*puVar3 | 1) != 0) {
        for (; (*puVar3 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (iVar1 != index);
  }
  return sVar4;
}

Assistant:

size_t WireFormatLite::Int64Size(const RepeatedField<int64>& value) {
  size_t out = 0;
  const int n = value.size();
  for (int i = 0; i < n; i++) {
    out += Int64Size(value.Get(i));
  }
  return out;
}